

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateField
               (FieldDescriptor *field,Printer *printer,bool is_descriptor)

{
  Printer *pPVar1;
  bool bVar2;
  OneofDescriptor *pOVar3;
  string *psVar4;
  FieldDescriptor *field_00;
  string local_40;
  byte local_19;
  Printer *pPStack_18;
  bool is_descriptor_local;
  Printer *printer_local;
  FieldDescriptor *field_local;
  
  local_19 = is_descriptor;
  pPStack_18 = printer;
  printer_local = (Printer *)field;
  bVar2 = FieldDescriptor::is_repeated(field);
  if (bVar2) {
    GenerateFieldDocComment(pPStack_18,(FieldDescriptor *)printer_local);
    pPVar1 = pPStack_18;
    psVar4 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)printer_local);
    io::Printer::Print(pPVar1,"private $^name^;\n","name",psVar4);
  }
  else {
    pOVar3 = FieldDescriptor::containing_oneof((FieldDescriptor *)printer_local);
    if (pOVar3 != (OneofDescriptor *)0x0) {
      return;
    }
    GenerateFieldDocComment(pPStack_18,(FieldDescriptor *)printer_local);
    pPVar1 = pPStack_18;
    psVar4 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)printer_local);
    DefaultForField_abi_cxx11_(&local_40,(php *)printer_local,field_00);
    io::Printer::Print(pPVar1,"private $^name^ = ^default^;\n","name",psVar4,"default",&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  pPVar1 = pPStack_18;
  if ((local_19 & 1) != 0) {
    psVar4 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)printer_local);
    io::Printer::Print(pPVar1,"private $has_^name^ = false;\n","name",psVar4);
  }
  return;
}

Assistant:

void GenerateField(const FieldDescriptor* field, io::Printer* printer,
                   bool is_descriptor) {
  if (field->is_repeated()) {
    GenerateFieldDocComment(printer, field);
    printer->Print(
        "private $^name^;\n",
        "name", field->name());
  } else if (field->containing_oneof()) {
    // Oneof fields are handled by GenerateOneofField.
    return;
  } else {
    GenerateFieldDocComment(printer, field);
    printer->Print(
        "private $^name^ = ^default^;\n",
        "name", field->name(),
        "default", DefaultForField(field));
  }

  if (is_descriptor) {
    printer->Print(
        "private $has_^name^ = false;\n",
        "name", field->name());
  }
}